

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_ManDumpUntests(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,int nFuncVars,char *pFileName,
                      int fVerbose)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int Count;
  int Value;
  int status;
  int nIters;
  int i;
  int nItersMax;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLits;
  FILE *pFile;
  int fVerbose_local;
  char *pFileName_local;
  int nFuncVars_local;
  sat_solver *pSat_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *pM_local;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = Gia_ManPiNum(pM);
  p = Vec_IntAlloc(iVar1 - nFuncVars);
  Value = 0;
  do {
    if (9999 < Value) {
LAB_006c3cbd:
      Vec_IntFree(p);
      fclose(__stream);
      return Value;
    }
    iVar1 = sat_solver_solve(pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar1 == 0) {
      printf("Timeout reached after dumping %d untestable faults.\n",(ulong)(uint)Value);
      goto LAB_006c3cbd;
    }
    if (iVar1 == -1) goto LAB_006c3cbd;
    Vec_IntClear(p);
    status = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(pM);
      bVar5 = false;
      if (status < iVar1) {
        _i = Gia_ManCi(pM,status);
        bVar5 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      if (nFuncVars <= status) {
        piVar3 = pCnf->pVarNums;
        iVar1 = Gia_ObjId(pM,_i);
        iVar1 = piVar3[iVar1];
        piVar3 = pCnf->pVarNums;
        iVar2 = Gia_ObjId(pM,_i);
        iVar2 = sat_solver_var_value(pSat,piVar3[iVar2]);
        iVar1 = Abc_Var2Lit(iVar1,iVar2);
        Vec_IntPush(p,iVar1);
      }
      status = status + 1;
    }
    for (status = 0; iVar1 = Vec_IntSize(p), status < iVar1; status = status + 1) {
      iVar1 = Vec_IntEntry(p,status);
      iVar1 = Abc_LitIsCompl(iVar1);
      if (iVar1 != 0) break;
    }
    iVar1 = Vec_IntSize(p);
    if (status < iVar1) {
      if (fVerbose != 0) {
        printf("Untestable fault %4d : ");
        for (status = 0; iVar1 = Vec_IntSize(p), status < iVar1; status = status + 1) {
          iVar1 = Vec_IntEntry(p,status);
          iVar1 = Abc_LitIsCompl(iVar1);
          if (iVar1 != 0) {
            printf("%d ",(ulong)(uint)status);
          }
        }
        printf("\n");
      }
      for (status = 0; iVar1 = Vec_IntSize(p), status < iVar1; status = status + 1) {
        iVar1 = Vec_IntEntry(p,status);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 != 0) {
          fprintf(__stream,"%d ",(ulong)(uint)status);
        }
      }
      fprintf(__stream,"\n");
    }
    piVar3 = Vec_IntArray(p);
    piVar4 = Vec_IntArray(p);
    iVar1 = Vec_IntSize(p);
    iVar1 = sat_solver_addclause(pSat,piVar3,piVar4 + iVar1);
    if (iVar1 == 0) goto LAB_006c3cbd;
    Value = Value + 1;
  } while( true );
}

Assistant:

int Gia_ManDumpUntests( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, int nFuncVars, char * pFileName, int fVerbose )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int nItersMax = 10000;
    int i, nIters, status, Value, Count = 0;
    vLits = Vec_IntAlloc( Gia_ManPiNum(pM) - nFuncVars );
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            printf( "Timeout reached after dumping %d untestable faults.\n", nIters );
        if ( status == l_Undef )
            break;
        if ( status == l_False )
            break;
        // collect literals
        Vec_IntClear( vLits );
        Gia_ManForEachPi( pM, pObj, i )
            if ( i >= nFuncVars )
                Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(pM, pObj)])) );
        // dump the fault
        Vec_IntForEachEntry( vLits, Value, i )
            if ( Abc_LitIsCompl(Value) )
                break;
        if ( i < Vec_IntSize(vLits) )
        {
            if ( fVerbose )
            {
                printf( "Untestable fault %4d : ", ++Count );
                Vec_IntForEachEntry( vLits, Value, i )
                    if ( Abc_LitIsCompl(Value) )
                        printf( "%d ", i );
                printf( "\n" );
            }
            Vec_IntForEachEntry( vLits, Value, i )
                if ( Abc_LitIsCompl(Value) )
                    fprintf( pFile, "%d ", i );
            fprintf( pFile, "\n" );
        }
        // add this clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            break;
    }
    Vec_IntFree( vLits );
    fclose( pFile );
    return nIters;
}